

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qundoview.cpp
# Opt level: O0

int __thiscall QUndoView::qt_metacall(QUndoView *this,Call _c,int _id,void **_a)

{
  uint uVar1;
  undefined8 *in_RCX;
  int in_ESI;
  QListView *in_RDI;
  long in_FS_OFFSET;
  void **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  Call in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QListView::qt_metacall
                    (in_RDI,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8);
  if (-1 < (int)uVar1) {
    if (in_ESI == 0) {
      if ((int)uVar1 < 2) {
        qt_static_metacall((QObject *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                           (Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)(ulong)uVar1);
      }
      uVar1 = uVar1 - 2;
    }
    if (in_ESI == 7) {
      if ((int)uVar1 < 2) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      uVar1 = uVar1 - 2;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall((QObject *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                         (Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)CONCAT44(in_ESI,uVar1));
      uVar1 = uVar1 - 2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

int QUndoView::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QListView::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}